

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionUtilsBullet.cpp
# Opt level: O3

bool chrono::collision::bt_utils::IntersectSegmentBox
               (cbtVector3 *hdims,cbtVector3 *c,cbtVector3 *a,cbtScalar hlen,cbtScalar tol,
               cbtScalar *tMin,cbtScalar *tMax)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001204 [12];
  float fVar16;
  undefined1 auVar17 [16];
  cbtScalar cVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  *tMin = -1e+18;
  *tMax = 1e+18;
  fVar1 = a->m_floats[0];
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar14);
  if (tol <= auVar14._0_4_) {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(ZEXT416((uint)hdims->m_floats[0]),auVar2);
    auVar21._0_4_ = (auVar14._0_4_ - c->m_floats[0]) / fVar1;
    auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar14 = ZEXT416((uint)((hdims->m_floats[0] - c->m_floats[0]) / fVar1));
    auVar2 = vminss_avx(auVar21,auVar14);
    auVar14 = vmaxss_avx(auVar21,auVar14);
    auVar2 = vmaxss_avx(ZEXT416((uint)*tMin),auVar2);
    *tMin = auVar2._0_4_;
    auVar14 = vminss_avx(ZEXT416((uint)*tMax),auVar14);
    cVar18 = auVar14._0_4_;
    *tMax = cVar18;
    if (cVar18 < *tMin) {
      return false;
    }
  }
  else {
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)c->m_floats[0]),auVar5);
    if (hdims->m_floats[0] < auVar14._0_4_) {
      return false;
    }
    cVar18 = 1e+18;
  }
  fVar1 = a->m_floats[1];
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar6);
  if (tol <= auVar14._0_4_) {
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(ZEXT416((uint)hdims->m_floats[1]),auVar12);
    auVar19._0_4_ = (hdims->m_floats[1] - c->m_floats[1]) / fVar1;
    auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar22._0_4_ = (auVar14._0_4_ - c->m_floats[1]) / fVar1;
    auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar2 = vminss_avx(auVar22,auVar19);
    auVar14 = vmaxss_avx(auVar22,auVar19);
    auVar2 = vmaxss_avx(ZEXT416((uint)*tMin),auVar2);
    *tMin = auVar2._0_4_;
    auVar14 = vminss_avx(ZEXT416((uint)*tMax),auVar14);
    cVar18 = auVar14._0_4_;
    *tMax = cVar18;
    if (cVar18 < *tMin) {
      return false;
    }
  }
  else {
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)c->m_floats[1]),auVar7);
    if (hdims->m_floats[1] < auVar14._0_4_) {
      return false;
    }
  }
  fVar1 = a->m_floats[2];
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar8);
  if (tol <= auVar14._0_4_) {
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(ZEXT416((uint)hdims->m_floats[2]),auVar11);
    auVar17._0_4_ = (hdims->m_floats[2] - c->m_floats[2]) / fVar1;
    auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar20._0_4_ = (auVar14._0_4_ - c->m_floats[2]) / fVar1;
    auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar2 = vminss_avx(auVar20,auVar17);
    auVar14 = vmaxss_avx(auVar20,auVar17);
    auVar2 = vmaxss_avx(ZEXT416((uint)*tMin),auVar2);
    *tMin = auVar2._0_4_;
    auVar14 = vminss_avx(ZEXT416((uint)*tMax),auVar14);
    cVar18 = auVar14._0_4_;
    *tMax = cVar18;
    fVar1 = *tMin;
    if (cVar18 < fVar1) {
      return false;
    }
  }
  else {
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)c->m_floats[2]),auVar9);
    if (hdims->m_floats[2] < auVar14._0_4_) {
      return false;
    }
    fVar1 = *tMin;
  }
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar13._4_12_ = in_register_00001204;
  auVar13._0_4_ = hlen;
  auVar15 = vxorps_avx512vl(auVar13,auVar10);
  fVar16 = auVar15._0_4_;
  if (((fVar16 <= fVar1) || (fVar16 <= cVar18)) && ((fVar1 <= hlen || (cVar18 <= hlen)))) {
    if ((fVar1 < fVar16) || (hlen < fVar1)) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar15,1);
      bVar4 = (bool)((byte)uVar3 & 1);
      *tMin = (cbtScalar)((uint)bVar4 * (int)fVar16 + (uint)!bVar4 * (int)hlen);
      cVar18 = *tMax;
    }
    if ((fVar16 <= cVar18) &&
       (auVar15._4_12_ = in_register_00001204, auVar15._0_4_ = hlen, cVar18 <= hlen)) {
      return true;
    }
    *tMax = auVar15._0_4_;
    return true;
  }
  return false;
}

Assistant:

bool IntersectSegmentBox(const cbtVector3& hdims,  // box half-dimensions
                         const cbtVector3& c,      // segment center point
                         const cbtVector3& a,      // segment direction (unit vector)
                         const cbtScalar hlen,     // segment half-length
                         const cbtScalar tol,      // tolerance for parallelism test
                         cbtScalar& tMin,          // segment parameter of first intersection point
                         cbtScalar& tMax           // segment parameter of second intersection point
) {
    tMin = -BT_LARGE_FLOAT;
    tMax = +BT_LARGE_FLOAT;

    if (std::abs(a.x()) < tol) {
        // Segment parallel to the box x-faces
        if (std::abs(c.x()) > hdims.x())
            return false;
    } else {
        cbtScalar t1 = (-hdims.x() - c.x()) / a.x();
        cbtScalar t2 = (+hdims.x() - c.x()) / a.x();

        tMin = cbtMax(tMin, cbtMin(t1, t2));
        tMax = cbtMin(tMax, cbtMax(t1, t2));

        if (tMin > tMax)
            return false;
    }

    if (std::abs(a.y()) < tol) {
        // Segment parallel to the box y-faces
        if (std::abs(c.y()) > hdims.y())
            return false;
    } else {
        cbtScalar t1 = (-hdims.y() - c.y()) / a.y();
        cbtScalar t2 = (+hdims.y() - c.y()) / a.y();

        tMin = cbtMax(tMin, cbtMin(t1, t2));
        tMax = cbtMin(tMax, cbtMax(t1, t2));

        if (tMin > tMax)
            return false;
    }

    if (std::abs(a.z()) < tol) {
        // Capsule axis parallel to the box z-faces
        if (std::abs(c.z()) > hdims.z())
            return false;
    } else {
        cbtScalar t1 = (-hdims.z() - c.z()) / a.z();
        cbtScalar t2 = (+hdims.z() - c.z()) / a.z();

        tMin = cbtMax(tMin, cbtMin(t1, t2));
        tMax = cbtMin(tMax, cbtMax(t1, t2));

        if (tMin > tMax)
            return false;
    }

    // If both intersection points are outside the segment, no intersection
    if ((tMin < -hlen && tMax < -hlen) || (tMin > +hlen && tMax > +hlen))
        return false;

    // Clamp intersection points to segment length
    ChClampValue(tMin, -hlen, +hlen);
    ChClampValue(tMax, -hlen, +hlen);

    return true;
}